

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLexer.cpp
# Opt level: O0

void __thiscall GrpLexer::mOP_PLUSEQUAL(GrpLexer *this,bool _createToken)

{
  Token *pTVar1;
  byte in_SIL;
  RefCount<Token> *in_RDI;
  RefCount<Token> *pRVar2;
  size_type _begin;
  RefToken _token;
  int _ttype;
  Token *in_stack_ffffffffffffff60;
  Token *in_stack_ffffffffffffff68;
  Token *in_stack_ffffffffffffff78;
  allocator *paVar3;
  RefCount<Token> *in_stack_ffffffffffffff80;
  undefined1 local_60 [31];
  allocator local_41;
  string local_40 [32];
  undefined8 local_20;
  RefCount<Token> local_18;
  int local_10;
  byte local_9;
  
  local_9 = in_SIL & 1;
  RefCount<Token>::RefCount(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_20 = std::__cxx11::string::length();
  local_10 = 5;
  paVar3 = &local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"+=",paVar3);
  (**(code **)&in_RDI->ref[0xb].count)(in_RDI,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((local_9 & 1) != 0) {
    in_stack_ffffffffffffff68 = RefCount::operator_cast_to_Token_((RefCount *)&local_18);
    in_stack_ffffffffffffff60 = RefCount::operator_cast_to_Token_((RefCount *)&nullToken);
    if ((in_stack_ffffffffffffff68 == in_stack_ffffffffffffff60) && (local_10 != -1)) {
      (**(code **)&in_RDI->ref[9].count)(local_60,in_RDI,local_10);
      RefCount<Token>::operator=(in_RDI,(RefCount<Token> *)in_stack_ffffffffffffff68);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_ffffffffffffff60);
      pTVar1 = RefCount<Token>::operator->(&local_18);
      pRVar2 = in_RDI + 1;
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,(ulong)pRVar2);
      (*pTVar1->_vptr_Token[6])(pTVar1,&stack0xffffffffffffff80);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    }
  }
  RefCount<Token>::operator=(in_RDI,(RefCount<Token> *)in_stack_ffffffffffffff68);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_ffffffffffffff60);
  return;
}

Assistant:

void GrpLexer::mOP_PLUSEQUAL(bool _createToken) {
	int _ttype; RefToken _token; auto _begin=text.length();
	_ttype = OP_PLUSEQUAL;
	
	match("+=");
	if ( _createToken && _token==nullToken && _ttype!=Token::SKIP ) {
	   _token = makeToken(_ttype);
	   _token->setText(text.substr(_begin, text.length()-_begin));
	}
	_returnToken = _token;
}